

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O3

bool __thiscall Analyzer::isVarCanBeNull(Analyzer *this,Node *node)

{
  Node *b;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  pointer ppVar4;
  long lVar5;
  ulong uVar6;
  
  if (node == (Node *)0x0) {
    return false;
  }
  bVar1 = true;
  if (node->nodeType != PNT_NULL) {
    uVar2 = (int)((long)nearest_assignments.
                        super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)nearest_assignments.
                        super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      uVar6 = uVar3 + 1;
      lVar5 = uVar3 * 0x18;
      ppVar4 = nearest_assignments.
               super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        b = *(Node **)((long)&ppVar4[-1].first + lVar5);
        if ((b != (Node *)0x0) &&
           (bVar1 = isNodeEquals(this,node,b),
           ppVar4 = nearest_assignments.
                    super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, bVar1)) {
          return *(int *)(*(long *)((long)nearest_assignments.
                                          super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x10)
                         + 0x10) == 1;
        }
        uVar6 = uVar6 - 1;
        lVar5 = lVar5 + -0x18;
      } while (1 < uVar6);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isVarCanBeNull(Node * node)
  {
    if (!node)
      return false;

    if (node->nodeType == PNT_NULL)
      return true;

    for (int i = int(nearest_assignments.size()) - 1; i >= 0; i--)
      if (nearest_assignments[i].first && isNodeEquals(node, nearest_assignments[i].first))
      {
        if (nearest_assignments[i].second.first->nodeType == PNT_NULL)
          return true;
        break;
      }

    return false;
  }